

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::wipeData(Server *this)

{
  wipePlayers(this);
  this->m_reliable = false;
  this->m_ranked = false;
  this->m_team_mode = 3;
  this->m_match_state = 1;
  this->m_game_type = 1;
  this->m_botsEnabled = true;
  this->m_subscribed = false;
  this->m_fully_connected = false;
  this->m_bot_count = 0;
  this->m_player_rdns_resolutions_pending = 0;
  std::
  vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ::clear(&this->buildings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mutators);
  std::vector<RenX::Map,_std::allocator<RenX::Map>_>::clear(&this->maps);
  this->m_awaitingPong = false;
  this->m_rconVersion = 0;
  (this->m_rconUser)._M_string_length = 0;
  *(this->m_rconUser)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void RenX::Server::wipeData() {
	wipePlayers();
	m_reliable = false;
	m_team_mode = 3;
	m_game_type = 1;
	m_ranked = false;
	m_botsEnabled = true;
	m_match_state = 1;
	m_subscribed = false;
	m_fully_connected = false;
	m_bot_count = 0;
	m_player_rdns_resolutions_pending = 0;
	this->buildings.clear();
	this->mutators.clear();
	this->maps.clear();
	m_awaitingPong = false;
	m_rconVersion = 0;
	m_rconUser.clear();
}